

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitCommand.cxx
# Opt level: O0

bool __thiscall cmCTestSubmitCommand::CheckArgumentValue(cmCTestSubmitCommand *this,string *arg)

{
  cmCTest *this_00;
  cmMakefile *pcVar1;
  bool bVar2;
  char *name;
  ostream *poVar3;
  string local_388;
  ostringstream local_368 [8];
  ostringstream e_1;
  string local_1e0;
  ostringstream local_1b0 [8];
  ostringstream e;
  Part local_24;
  string *psStack_20;
  Part p;
  string *arg_local;
  cmCTestSubmitCommand *this_local;
  
  psStack_20 = arg;
  arg_local = (string *)this;
  if ((this->super_cmCTestHandlerCommand).ArgumentDoing == 3) {
    this_00 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    name = (char *)std::__cxx11::string::c_str();
    local_24 = cmCTest::GetPartFromName(this_00,name);
    if (local_24 == PartCount) {
      std::__cxx11::ostringstream::ostringstream(local_1b0);
      poVar3 = std::operator<<((ostream *)local_1b0,"Part name \"");
      poVar3 = std::operator<<(poVar3,(string *)psStack_20);
      std::operator<<(poVar3,"\" is invalid.");
      pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      (this->super_cmCTestHandlerCommand).ArgumentDoing = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1b0);
    }
    else {
      std::set<cmCTest::Part,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_>::insert
                (&this->Parts,&local_24);
    }
    this_local._7_1_ = true;
  }
  else if ((this->super_cmCTestHandlerCommand).ArgumentDoing == 4) {
    bVar2 = cmsys::SystemTools::FileExists(arg);
    if (bVar2) {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(&this->Files,psStack_20);
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_368);
      poVar3 = std::operator<<((ostream *)local_368,"File \"");
      poVar3 = std::operator<<(poVar3,(string *)psStack_20);
      poVar3 = std::operator<<(poVar3,"\" does not exist. Cannot submit ");
      std::operator<<(poVar3,"a non-existent file.");
      pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_388);
      std::__cxx11::string::~string((string *)&local_388);
      (this->super_cmCTestHandlerCommand).ArgumentDoing = 1;
      std::__cxx11::ostringstream::~ostringstream(local_368);
    }
    this_local._7_1_ = true;
  }
  else if ((this->super_cmCTestHandlerCommand).ArgumentDoing == 9) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->HttpHeaders,arg);
    this_local._7_1_ = true;
  }
  else if ((this->super_cmCTestHandlerCommand).ArgumentDoing == 6) {
    std::__cxx11::string::operator=((string *)&this->RetryCount,(string *)arg);
    this_local._7_1_ = true;
  }
  else if ((this->super_cmCTestHandlerCommand).ArgumentDoing == 5) {
    std::__cxx11::string::operator=((string *)&this->RetryDelay,(string *)arg);
    this_local._7_1_ = true;
  }
  else if ((this->super_cmCTestHandlerCommand).ArgumentDoing == 7) {
    (this->super_cmCTestHandlerCommand).ArgumentDoing = 0;
    std::__cxx11::string::operator=((string *)&this->CDashUploadFile,(string *)arg);
    this_local._7_1_ = true;
  }
  else if ((this->super_cmCTestHandlerCommand).ArgumentDoing == 8) {
    (this->super_cmCTestHandlerCommand).ArgumentDoing = 0;
    std::__cxx11::string::operator=((string *)&this->CDashUploadType,(string *)arg);
    this_local._7_1_ = true;
  }
  else if ((this->super_cmCTestHandlerCommand).ArgumentDoing == 10) {
    (this->super_cmCTestHandlerCommand).ArgumentDoing = 0;
    std::__cxx11::string::operator=((string *)&this->SubmitURL,(string *)arg);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ =
         cmCTestHandlerCommand::CheckArgumentValue(&this->super_cmCTestHandlerCommand,arg);
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestSubmitCommand::CheckArgumentValue(std::string const& arg)
{
  // Handle states specific to this command.
  if (this->ArgumentDoing == ArgumentDoingParts) {
    cmCTest::Part p = this->CTest->GetPartFromName(arg.c_str());
    if (p != cmCTest::PartCount) {
      this->Parts.insert(p);
    } else {
      std::ostringstream e;
      e << "Part name \"" << arg << "\" is invalid.";
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      this->ArgumentDoing = ArgumentDoingError;
    }
    return true;
  }

  if (this->ArgumentDoing == ArgumentDoingFiles) {
    if (cmSystemTools::FileExists(arg)) {
      this->Files.insert(arg);
    } else {
      std::ostringstream e;
      e << "File \"" << arg << "\" does not exist. Cannot submit "
        << "a non-existent file.";
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      this->ArgumentDoing = ArgumentDoingError;
    }
    return true;
  }

  if (this->ArgumentDoing == ArgumentDoingHttpHeader) {
    this->HttpHeaders.push_back(arg);
    return true;
  }

  if (this->ArgumentDoing == ArgumentDoingRetryCount) {
    this->RetryCount = arg;
    return true;
  }

  if (this->ArgumentDoing == ArgumentDoingRetryDelay) {
    this->RetryDelay = arg;
    return true;
  }

  if (this->ArgumentDoing == ArgumentDoingCDashUpload) {
    this->ArgumentDoing = ArgumentDoingNone;
    this->CDashUploadFile = arg;
    return true;
  }

  if (this->ArgumentDoing == ArgumentDoingCDashUploadType) {
    this->ArgumentDoing = ArgumentDoingNone;
    this->CDashUploadType = arg;
    return true;
  }

  if (this->ArgumentDoing == ArgumentDoingSubmitURL) {
    this->ArgumentDoing = ArgumentDoingNone;
    this->SubmitURL = arg;
    return true;
  }

  // Look for other arguments.
  return this->Superclass::CheckArgumentValue(arg);
}